

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory,Color color,
          Any test_type,Offset<void> test,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test4,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
          testarrayoftables,Offset<MyGame::Example::Monster> enemy,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testnestedflatbuffer,
          Offset<MyGame::Example::Stat> testempty,bool testbool,int32_t testhashs32_fnv1,
          uint32_t testhashu32_fnv1,int64_t testhashs64_fnv1,uint64_t testhashu64_fnv1,
          int32_t testhashs32_fnv1a,uint32_t testhashu32_fnv1a,int64_t testhashs64_fnv1a,
          uint64_t testhashu64_fnv1a,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testarrayofbools,float testf,
          float testf2,float testf3,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring2,
          Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
          testarrayofsortedstruct,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> flex,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test5,
          Offset<flatbuffers::Vector<long,_unsigned_int>_> vector_of_longs,
          Offset<flatbuffers::Vector<double,_unsigned_int>_> vector_of_doubles,
          Offset<MyGame::InParentNamespace> parent_namespace_test,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_referrables,uint64_t single_weak_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_weak_references,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_strong_referrables,uint64_t co_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_co_owning_references,
          uint64_t non_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_non_owning_references,
          AnyUniqueAliases any_unique_type,Offset<void> any_unique,
          AnyAmbiguousAliases any_ambiguous_type,Offset<void> any_ambiguous,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums,Race signed_enum
          ,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
          scalar_key_sorted_tables,Test *native_inline,LongEnum long_enum_non_enum_default,
          LongEnum long_enum_normal_default,float nan_default,float inf_default,
          float positive_inf_default,float infinity_default,float positive_infinity_default,
          float negative_inf_default,float negative_infinity_default,double double_inf_default)

{
  Offset<MyGame::Example::Monster> OVar1;
  undefined1 local_e8 [8];
  MonsterBuilder builder_;
  float positive_infinity_default_local;
  float infinity_default_local;
  float positive_inf_default_local;
  float inf_default_local;
  float nan_default_local;
  float testf3_local;
  float testf2_local;
  float testf_local;
  bool testbool_local;
  int16_t hp_local;
  int16_t mana_local;
  Vec3 *pos_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
  scalar_key_sorted_tables_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums_local;
  Offset<void> any_ambiguous_local;
  Offset<void> any_unique_local;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_non_owning_references_local;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_co_owning_references_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  vector_of_strong_referrables_local;
  Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_weak_references_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
  vector_of_referrables_local;
  Offset<MyGame::InParentNamespace> parent_namespace_test_local;
  Offset<flatbuffers::Vector<double,_unsigned_int>_> vector_of_doubles_local;
  Offset<flatbuffers::Vector<long,_unsigned_int>_> vector_of_longs_local;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test5_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> flex_local;
  Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
  testarrayofsortedstruct_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  testarrayofstring2_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testarrayofbools_local;
  Offset<MyGame::Example::Stat> testempty_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testnestedflatbuffer_local;
  Offset<MyGame::Example::Monster> enemy_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
  testarrayoftables_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  testarrayofstring_local;
  Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test4_local;
  Offset<void> test_local;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory_local;
  Offset<flatbuffers::String> name_local;
  
  builder_.start_ = (uoffset_t)positive_infinity_default;
  builder_._12_4_ = infinity_default;
  MonsterBuilder::MonsterBuilder((MonsterBuilder *)local_e8,_fbb);
  MonsterBuilder::add_double_inf_default((MonsterBuilder *)local_e8,double_inf_default);
  MonsterBuilder::add_long_enum_normal_default((MonsterBuilder *)local_e8,long_enum_normal_default);
  MonsterBuilder::add_long_enum_non_enum_default
            ((MonsterBuilder *)local_e8,long_enum_non_enum_default);
  MonsterBuilder::add_non_owning_reference((MonsterBuilder *)local_e8,non_owning_reference);
  MonsterBuilder::add_co_owning_reference((MonsterBuilder *)local_e8,co_owning_reference);
  MonsterBuilder::add_single_weak_reference((MonsterBuilder *)local_e8,single_weak_reference);
  MonsterBuilder::add_testhashu64_fnv1a((MonsterBuilder *)local_e8,testhashu64_fnv1a);
  MonsterBuilder::add_testhashs64_fnv1a((MonsterBuilder *)local_e8,testhashs64_fnv1a);
  MonsterBuilder::add_testhashu64_fnv1((MonsterBuilder *)local_e8,testhashu64_fnv1);
  MonsterBuilder::add_testhashs64_fnv1((MonsterBuilder *)local_e8,testhashs64_fnv1);
  MonsterBuilder::add_negative_infinity_default
            ((MonsterBuilder *)local_e8,negative_infinity_default);
  MonsterBuilder::add_negative_inf_default((MonsterBuilder *)local_e8,negative_inf_default);
  MonsterBuilder::add_positive_infinity_default((MonsterBuilder *)local_e8,(float)builder_.start_);
  MonsterBuilder::add_infinity_default((MonsterBuilder *)local_e8,(float)builder_._12_4_);
  MonsterBuilder::add_positive_inf_default((MonsterBuilder *)local_e8,positive_inf_default);
  MonsterBuilder::add_inf_default((MonsterBuilder *)local_e8,inf_default);
  MonsterBuilder::add_nan_default((MonsterBuilder *)local_e8,nan_default);
  MonsterBuilder::add_native_inline((MonsterBuilder *)local_e8,native_inline);
  MonsterBuilder::add_scalar_key_sorted_tables((MonsterBuilder *)local_e8,scalar_key_sorted_tables);
  MonsterBuilder::add_testrequirednestedflatbuffer
            ((MonsterBuilder *)local_e8,testrequirednestedflatbuffer);
  MonsterBuilder::add_vector_of_enums((MonsterBuilder *)local_e8,vector_of_enums);
  MonsterBuilder::add_any_ambiguous((MonsterBuilder *)local_e8,any_ambiguous);
  MonsterBuilder::add_any_unique((MonsterBuilder *)local_e8,any_unique);
  MonsterBuilder::add_vector_of_non_owning_references
            ((MonsterBuilder *)local_e8,vector_of_non_owning_references);
  MonsterBuilder::add_vector_of_co_owning_references
            ((MonsterBuilder *)local_e8,vector_of_co_owning_references);
  MonsterBuilder::add_vector_of_strong_referrables
            ((MonsterBuilder *)local_e8,vector_of_strong_referrables);
  MonsterBuilder::add_vector_of_weak_references
            ((MonsterBuilder *)local_e8,vector_of_weak_references);
  MonsterBuilder::add_vector_of_referrables((MonsterBuilder *)local_e8,vector_of_referrables);
  MonsterBuilder::add_parent_namespace_test((MonsterBuilder *)local_e8,parent_namespace_test);
  MonsterBuilder::add_vector_of_doubles((MonsterBuilder *)local_e8,vector_of_doubles);
  MonsterBuilder::add_vector_of_longs((MonsterBuilder *)local_e8,vector_of_longs);
  MonsterBuilder::add_test5((MonsterBuilder *)local_e8,test5);
  MonsterBuilder::add_flex((MonsterBuilder *)local_e8,flex);
  MonsterBuilder::add_testarrayofsortedstruct((MonsterBuilder *)local_e8,testarrayofsortedstruct);
  MonsterBuilder::add_testarrayofstring2((MonsterBuilder *)local_e8,testarrayofstring2);
  MonsterBuilder::add_testf3((MonsterBuilder *)local_e8,testf3);
  MonsterBuilder::add_testf2((MonsterBuilder *)local_e8,testf2);
  MonsterBuilder::add_testf((MonsterBuilder *)local_e8,testf);
  MonsterBuilder::add_testarrayofbools((MonsterBuilder *)local_e8,testarrayofbools);
  MonsterBuilder::add_testhashu32_fnv1a((MonsterBuilder *)local_e8,testhashu32_fnv1a);
  MonsterBuilder::add_testhashs32_fnv1a((MonsterBuilder *)local_e8,testhashs32_fnv1a);
  MonsterBuilder::add_testhashu32_fnv1((MonsterBuilder *)local_e8,testhashu32_fnv1);
  MonsterBuilder::add_testhashs32_fnv1((MonsterBuilder *)local_e8,testhashs32_fnv1);
  MonsterBuilder::add_testempty((MonsterBuilder *)local_e8,testempty);
  MonsterBuilder::add_testnestedflatbuffer((MonsterBuilder *)local_e8,testnestedflatbuffer);
  MonsterBuilder::add_enemy((MonsterBuilder *)local_e8,enemy);
  MonsterBuilder::add_testarrayoftables((MonsterBuilder *)local_e8,testarrayoftables);
  MonsterBuilder::add_testarrayofstring((MonsterBuilder *)local_e8,testarrayofstring);
  MonsterBuilder::add_test4((MonsterBuilder *)local_e8,test4);
  MonsterBuilder::add_test((MonsterBuilder *)local_e8,test);
  MonsterBuilder::add_inventory((MonsterBuilder *)local_e8,inventory);
  MonsterBuilder::add_name((MonsterBuilder *)local_e8,name);
  MonsterBuilder::add_pos((MonsterBuilder *)local_e8,pos);
  MonsterBuilder::add_hp((MonsterBuilder *)local_e8,hp);
  MonsterBuilder::add_mana((MonsterBuilder *)local_e8,mana);
  MonsterBuilder::add_signed_enum((MonsterBuilder *)local_e8,signed_enum);
  MonsterBuilder::add_any_ambiguous_type((MonsterBuilder *)local_e8,any_ambiguous_type);
  MonsterBuilder::add_any_unique_type((MonsterBuilder *)local_e8,any_unique_type);
  MonsterBuilder::add_testbool((MonsterBuilder *)local_e8,testbool);
  MonsterBuilder::add_test_type((MonsterBuilder *)local_e8,test_type);
  MonsterBuilder::add_color((MonsterBuilder *)local_e8,color);
  OVar1 = MonsterBuilder::Finish((MonsterBuilder *)local_e8);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    const MyGame::Example::Vec3 *pos = nullptr,
    int16_t mana = 150,
    int16_t hp = 100,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> inventory = 0,
    MyGame::Example::Color color = MyGame::Example::Color_Blue,
    MyGame::Example::Any test_type = MyGame::Example::Any_NONE,
    ::flatbuffers::Offset<void> test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test4 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Monster>>> testarrayoftables = 0,
    ::flatbuffers::Offset<MyGame::Example::Monster> enemy = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testnestedflatbuffer = 0,
    ::flatbuffers::Offset<MyGame::Example::Stat> testempty = 0,
    bool testbool = false,
    int32_t testhashs32_fnv1 = 0,
    uint32_t testhashu32_fnv1 = 0,
    int64_t testhashs64_fnv1 = 0,
    uint64_t testhashu64_fnv1 = 0,
    int32_t testhashs32_fnv1a = 0,
    uint32_t testhashu32_fnv1a = 0,
    int64_t testhashs64_fnv1a = 0,
    uint64_t testhashu64_fnv1a = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testarrayofbools = 0,
    float testf = 3.14159f,
    float testf2 = 3.0f,
    float testf3 = 0.0f,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring2 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Ability *>> testarrayofsortedstruct = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> flex = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test5 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<int64_t>> vector_of_longs = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<double>> vector_of_doubles = 0,
    ::flatbuffers::Offset<MyGame::InParentNamespace> parent_namespace_test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_referrables = 0,
    uint64_t single_weak_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_weak_references = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_strong_referrables = 0,
    uint64_t co_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_co_owning_references = 0,
    uint64_t non_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_non_owning_references = 0,
    MyGame::Example::AnyUniqueAliases any_unique_type = MyGame::Example::AnyUniqueAliases_NONE,
    ::flatbuffers::Offset<void> any_unique = 0,
    MyGame::Example::AnyAmbiguousAliases any_ambiguous_type = MyGame::Example::AnyAmbiguousAliases_NONE,
    ::flatbuffers::Offset<void> any_ambiguous = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> vector_of_enums = 0,
    MyGame::Example::Race signed_enum = MyGame::Example::Race_None,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testrequirednestedflatbuffer = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Stat>>> scalar_key_sorted_tables = 0,
    const MyGame::Example::Test *native_inline = nullptr,
    MyGame::Example::LongEnum long_enum_non_enum_default = static_cast<MyGame::Example::LongEnum>(0),
    MyGame::Example::LongEnum long_enum_normal_default = MyGame::Example::LongEnum_LongOne,
    float nan_default = std::numeric_limits<float>::quiet_NaN(),
    float inf_default = std::numeric_limits<float>::infinity(),
    float positive_inf_default = std::numeric_limits<float>::infinity(),
    float infinity_default = std::numeric_limits<float>::infinity(),
    float positive_infinity_default = std::numeric_limits<float>::infinity(),
    float negative_inf_default = -std::numeric_limits<float>::infinity(),
    float negative_infinity_default = -std::numeric_limits<float>::infinity(),
    double double_inf_default = std::numeric_limits<double>::infinity()) {
  MonsterBuilder builder_(_fbb);
  builder_.add_double_inf_default(double_inf_default);
  builder_.add_long_enum_normal_default(long_enum_normal_default);
  builder_.add_long_enum_non_enum_default(long_enum_non_enum_default);
  builder_.add_non_owning_reference(non_owning_reference);
  builder_.add_co_owning_reference(co_owning_reference);
  builder_.add_single_weak_reference(single_weak_reference);
  builder_.add_testhashu64_fnv1a(testhashu64_fnv1a);
  builder_.add_testhashs64_fnv1a(testhashs64_fnv1a);
  builder_.add_testhashu64_fnv1(testhashu64_fnv1);
  builder_.add_testhashs64_fnv1(testhashs64_fnv1);
  builder_.add_negative_infinity_default(negative_infinity_default);
  builder_.add_negative_inf_default(negative_inf_default);
  builder_.add_positive_infinity_default(positive_infinity_default);
  builder_.add_infinity_default(infinity_default);
  builder_.add_positive_inf_default(positive_inf_default);
  builder_.add_inf_default(inf_default);
  builder_.add_nan_default(nan_default);
  builder_.add_native_inline(native_inline);
  builder_.add_scalar_key_sorted_tables(scalar_key_sorted_tables);
  builder_.add_testrequirednestedflatbuffer(testrequirednestedflatbuffer);
  builder_.add_vector_of_enums(vector_of_enums);
  builder_.add_any_ambiguous(any_ambiguous);
  builder_.add_any_unique(any_unique);
  builder_.add_vector_of_non_owning_references(vector_of_non_owning_references);
  builder_.add_vector_of_co_owning_references(vector_of_co_owning_references);
  builder_.add_vector_of_strong_referrables(vector_of_strong_referrables);
  builder_.add_vector_of_weak_references(vector_of_weak_references);
  builder_.add_vector_of_referrables(vector_of_referrables);
  builder_.add_parent_namespace_test(parent_namespace_test);
  builder_.add_vector_of_doubles(vector_of_doubles);
  builder_.add_vector_of_longs(vector_of_longs);
  builder_.add_test5(test5);
  builder_.add_flex(flex);
  builder_.add_testarrayofsortedstruct(testarrayofsortedstruct);
  builder_.add_testarrayofstring2(testarrayofstring2);
  builder_.add_testf3(testf3);
  builder_.add_testf2(testf2);
  builder_.add_testf(testf);
  builder_.add_testarrayofbools(testarrayofbools);
  builder_.add_testhashu32_fnv1a(testhashu32_fnv1a);
  builder_.add_testhashs32_fnv1a(testhashs32_fnv1a);
  builder_.add_testhashu32_fnv1(testhashu32_fnv1);
  builder_.add_testhashs32_fnv1(testhashs32_fnv1);
  builder_.add_testempty(testempty);
  builder_.add_testnestedflatbuffer(testnestedflatbuffer);
  builder_.add_enemy(enemy);
  builder_.add_testarrayoftables(testarrayoftables);
  builder_.add_testarrayofstring(testarrayofstring);
  builder_.add_test4(test4);
  builder_.add_test(test);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_signed_enum(signed_enum);
  builder_.add_any_ambiguous_type(any_ambiguous_type);
  builder_.add_any_unique_type(any_unique_type);
  builder_.add_testbool(testbool);
  builder_.add_test_type(test_type);
  builder_.add_color(color);
  return builder_.Finish();
}